

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O1

void __thiscall soul::heart::Parser::checkVersionDeclaration(Parser *this)

{
  SourceCodeText *o;
  char *__s1;
  SourceCodeText *o_00;
  long lVar1;
  int iVar2;
  CodeLocation errorContext;
  CodeLocation local_d0;
  CompileMessage local_c0;
  CompileMessage local_88;
  CompileMessage local_50;
  
  o = (this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      ).location.sourceCode.object;
  if (o != (SourceCodeText *)0x0) {
    (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
  }
  local_d0.location.data =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.location.data;
  local_d0.sourceCode.object = o;
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x2afa3f);
  Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>::
  expect<char_const*>((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                       *)this,"SOUL");
  __s1 = (this->
         super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
         ).currentType.text;
  if (__s1 != "$integer32") {
    if (__s1 != (char *)0x0) {
      iVar2 = strcmp(__s1,"$integer32");
      if (iVar2 == 0) goto LAB_0024cf96;
    }
    CompileMessageHelpers::createMessage<>
              (&local_50,syntax,error,"Expected a valid version number after the #SOUL directive");
    CodeLocation::throwError(&local_d0,&local_50);
  }
LAB_0024cf96:
  o_00 = (this->
         super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
         ).location.sourceCode.object;
  if (o_00 != (SourceCodeText *)0x0) {
    (o_00->super_RefCountedObject).refCount = (o_00->super_RefCountedObject).refCount + 1;
  }
  local_d0.sourceCode.object = o_00;
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
  local_d0.location.data =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.location.data;
  lVar1 = (this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ).literalIntValue;
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x289c89);
  if (0 < lVar1) {
    if (lVar1 == 1) {
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o_00);
      return;
    }
    CompileMessageHelpers::createMessage<>
              (&local_c0,syntax,error,
               "Cannot parse code that was generated by a later version of the API");
    CodeLocation::throwError(&local_d0,&local_c0);
  }
  CompileMessageHelpers::createMessage<>
            (&local_88,syntax,error,"Expected a valid version number after the #SOUL directive");
  CodeLocation::throwError(&local_d0,&local_88);
}

Assistant:

void checkVersionDeclaration()
    {
        auto errorContext = location;
        expect (HEARTOperator::hash);
        expect (getHEARTFormatVersionPrefix());

        if (! matches (Token::literalInt32))
            errorContext.throwError (Errors::expectedVersionNumber());

        errorContext = location;
        auto version = parseLiteralInt();

        if (version <= 0)
            errorContext.throwError (Errors::expectedVersionNumber());

        if (version > getHEARTFormatVersion())
            errorContext.throwError (Errors::wrongAPIVersion());
    }